

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.cc
# Opt level: O0

int bf_ecb_cipher(EVP_CIPHER_CTX *ctx,uint8_t *out,uint8_t *in,size_t len)

{
  BF_KEY *key;
  BF_KEY *bf_key;
  size_t len_local;
  uint8_t *in_local;
  uint8_t *out_local;
  EVP_CIPHER_CTX *ctx_local;
  
  key = (BF_KEY *)ctx->cipher_data;
  len_local = (size_t)in;
  in_local = out;
  for (bf_key = (BF_KEY *)len; (BF_KEY *)0x7 < bf_key; bf_key = (BF_KEY *)(bf_key[-1].S + 0x3fe)) {
    BF_ecb_encrypt((uchar *)len_local,in_local,key,ctx->encrypt);
    len_local = len_local + 8;
    in_local = in_local + 8;
  }
  if (bf_key == (BF_KEY *)0x0) {
    return 1;
  }
  __assert_fail("len == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish.cc"
                ,0x216,"int bf_ecb_cipher(EVP_CIPHER_CTX *, uint8_t *, const uint8_t *, size_t)");
}

Assistant:

static int bf_ecb_cipher(EVP_CIPHER_CTX *ctx, uint8_t *out, const uint8_t *in,
                         size_t len) {
  BF_KEY *bf_key = reinterpret_cast<BF_KEY *>(ctx->cipher_data);

  while (len >= BF_BLOCK) {
    BF_ecb_encrypt(in, out, bf_key, ctx->encrypt);
    in += BF_BLOCK;
    out += BF_BLOCK;
    len -= BF_BLOCK;
  }
  assert(len == 0);

  return 1;
}